

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::str_cat_impl<char_const*>(stringstream *ss,char **x)

{
  undefined8 *in_RSI;
  stringstream *in_RDI;
  
  std::operator<<((ostream *)(in_RDI + 0x10),(char *)*in_RSI);
  str_cat_impl(in_RDI);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}